

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listtype.c
# Opt level: O2

LuciObject * list_get_object(LuciObject *list,long index)

{
  LuciObject *pLVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  
  if ((list == (LuciObject *)0x0) || (list->type != &obj_list_t)) {
    pcVar3 = "Can\'t iterate over non-list object\n";
  }
  else {
    while (index < 0) {
      iVar4 = (int)index;
      iVar2 = -iVar4;
      if (iVar4 < 1) {
        iVar2 = iVar4;
      }
      index = (long)(iVar2 + *(uint *)&list[1].field_0x8);
    }
    if ((ulong)index < (ulong)*(uint *)&list[1].field_0x8) {
      pLVar1 = (LuciObject *)(**(code **)(*(long *)(&(list[1].type)->type_name)[index] + 0x10))();
      return pLVar1;
    }
    pcVar3 = "List index out of bounds\n";
  }
  fprintf(_stderr,"FATAL: %s",pcVar3);
  exit(1);
}

Assistant:

static LuciObject *list_get_object(LuciObject *list, long index)
{
    if (!list || (!ISTYPE(list, obj_list_t))) {
	LUCI_DIE("%s", "Can't iterate over non-list object\n");
    }

    LuciListObj *listobj = (LuciListObj *)list;

    /* convert negative indices to a index starting from list end */
    while (index < 0) {
	index = listobj->count - abs(index);
    }

    if (index >= listobj->count) {
	LUCI_DIE("%s", "List index out of bounds\n");
    }
    LuciObject *item = listobj->items[index];
    return item->type->copy(item);
}